

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O0

void __thiscall
despot::VNode::VNode(VNode *this,Belief *belief,int depth,QNode *parent,OBS_TYPE edge)

{
  OBS_TYPE edge_local;
  QNode *parent_local;
  int depth_local;
  Belief *belief_local;
  VNode *this_local;
  
  std::vector<despot::State_*,_std::allocator<despot::State_*>_>::vector(&this->particles_);
  this->belief_ = belief;
  this->depth_ = depth;
  this->parent_ = parent;
  this->edge_ = edge;
  std::vector<despot::QNode_*,_std::allocator<despot::QNode_*>_>::vector(&this->children_);
  ValuedAction::ValuedAction(&this->default_move_);
  this->vstar = this;
  this->likelihood = 1.0;
  return;
}

Assistant:

VNode::VNode(Belief* belief, int depth, QNode* parent, OBS_TYPE edge) :
	belief_(belief),
	depth_(depth),
	parent_(parent),
	edge_(edge),
	vstar(this),
	likelihood(1) {
}